

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void hash_table_create(hash_table_t *table,uint initial_size,_func_int_void_ptr_void_ptr *is_equal,
                      _func_size_t_void_ptr *hash)

{
  hash_table_t *phVar1;
  int iVar2;
  hash_table_bucket_t *phVar3;
  universal_hash_function_t local_48;
  uint local_2c;
  _func_size_t_void_ptr *p_Stack_28;
  uint i;
  _func_size_t_void_ptr *hash_local;
  _func_int_void_ptr_void_ptr *is_equal_local;
  hash_table_t *phStack_10;
  uint initial_size_local;
  hash_table_t *table_local;
  
  is_equal_local._4_4_ = initial_size;
  if (initial_size < 2) {
    is_equal_local._4_4_ = 2;
  }
  table->n_items = 0;
  p_Stack_28 = hash;
  hash_local = (_func_size_t_void_ptr *)is_equal;
  phStack_10 = table;
  iVar2 = uint32_log2(is_equal_local._4_4_ - 1);
  phStack_10->n_buckets = 1 << ((char)iVar2 + 1U & 0x1f);
  phVar3 = (hash_table_bucket_t *)calloc((ulong)(phStack_10->n_buckets << 1),0x10);
  phVar1 = phStack_10;
  phStack_10->allocs = phVar3;
  if (phStack_10->allocs == (hash_table_bucket_t *)0x0) {
    fprintf(_stderr,"hash_table_create: Insufficient memory\n");
    abort();
  }
  phStack_10->buckets = phStack_10->allocs + 1;
  phStack_10->free_buckets = phStack_10->allocs + (ulong)phStack_10->n_buckets + 1;
  for (local_2c = 0; local_2c < is_equal_local._4_4_ - 1; local_2c = local_2c + 1) {
    phStack_10->free_buckets[local_2c].next = phStack_10->free_buckets + (local_2c + 1);
  }
  phStack_10->free_buckets[is_equal_local._4_4_ - 1].next = (hash_table_bucket_t *)0x0;
  phStack_10->is_equal = (_func_int_void_ptr_void_ptr *)hash_local;
  phStack_10->hash = p_Stack_28;
  phStack_10->seed = 0;
  new_universal_hash_function(&local_48,&phStack_10->seed,phStack_10->n_buckets);
  (phVar1->ghash).mult = local_48.mult;
  (phVar1->ghash).add = local_48.add;
  (phVar1->ghash).log2_buckets = local_48.log2_buckets;
  *(undefined4 *)&(phVar1->ghash).field_0x14 = local_48._20_4_;
  phStack_10->max_load = 1.0;
  phStack_10->max_collisions = 5;
  return;
}

Assistant:

void hash_table_create( hash_table_t * table, unsigned initial_size,
       int (*is_equal)(const void * a, const void * b),
       size_t (*hash)(const void * x) ) 
{
    unsigned i;
    if (initial_size < 2 ) initial_size = 2;

    table->n_items = 0;
    table->n_buckets = 1u << (int_log2( initial_size-1) + 1 );
    table->allocs  
        = calloc( 2*table->n_buckets, sizeof(hash_table_bucket_t));
    if ( table->allocs == NULL) {
        fprintf( stderr, "hash_table_create: Insufficient memory\n");
        abort();
    }

    table->buckets = table->allocs + 1;
    table->free_buckets  = table->allocs + table->n_buckets + 1;
    
    /* initialize free list */
    for ( i = 0; i < initial_size - 1; ++i )
        table->free_buckets[i].next = &table->free_buckets[i+1];
    table->free_buckets[initial_size-1].next = NULL;

    table->is_equal = is_equal;
    table->hash = hash;
    table->seed = 0;
    table->ghash 
        = new_universal_hash_function( &table->seed, table->n_buckets );

    /* some configurable constants */
    table->max_load = 1.0;
    table->max_collisions = 5;
}